

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O2

void __thiscall TRM::Bitmap::ReadFromFile(Bitmap *this,char *filename)

{
  ulong uVar1;
  size_t __n;
  ulong uVar2;
  bool bVar3;
  Color color;
  int n;
  int y;
  int x;
  array<unsigned_char,_4UL> local_70;
  uint32_t local_6c;
  uint32_t local_68;
  int local_64;
  Bitmap *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  stbi_uc *local_40;
  uint local_38;
  uint local_34;
  
  uVar1 = 0;
  local_40 = stbi_load(filename,(int *)&local_34,(int *)&local_38,&local_64,0);
  local_60 = this;
  std::vector<TRM::Color,_std::allocator<TRM::Color>_>::resize
            (&this->fPixels,(long)(int)(local_38 * local_34));
  local_6c = local_38;
  local_50 = 0;
  if (0 < (int)local_38) {
    local_50 = (ulong)local_38;
  }
  local_68 = local_34;
  local_58 = 0;
  if (0 < (int)local_34) {
    local_58 = (ulong)local_34;
  }
  while( true ) {
    uVar2 = local_50;
    local_48 = uVar1;
    if (uVar1 == local_58) break;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      Color::Color((Color *)&local_70);
      __n = (size_t)local_64;
      memcpy(&local_70,local_40 + uVar1 * __n,__n);
      if ((long)__n < 4) {
        local_70._M_elems[3] = 0xff;
      }
      *&(this->fPixels).super__Vector_base<TRM::Color,_std::allocator<TRM::Color>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1].fRGBA._M_elems = local_70._M_elems;
      uVar1 = uVar1 + (long)(int)local_34;
    }
    uVar1 = local_48 + 1;
  }
  local_60->fWidth = local_68;
  local_60->fHeight = local_6c;
  return;
}

Assistant:

void Bitmap::ReadFromFile(const char *filename) {
  int x, y, n;
  unsigned char *data = stbi_load(filename, &x, &y, &n, 0);
  fPixels.resize(x * y);
  for (int i = 0; i < x; i++) {
    for (int j = 0; j < y; j++) {
      Color color;
      std::memcpy(color.rgba().data(), data + (j * x + i) * n, n);
      if (n < 4) {
        color.rgba()[3] = 255;
      }
      fPixels[j * x + i] = color;
    }
  }

  fWidth = x;
  fHeight = y;
}